

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_data(Integer g_a,Integer ndim,Integer *dims,Integer type)

{
  global_array_t *pgVar1;
  global_array_t *pgVar2;
  Integer IVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set data on array that has been allocated",0);
  }
  if (ndim - 8U < 0xfffffffffffffff9) {
    pnga_error("unsupported number of dimensions",ndim);
  }
  lVar6 = g_a + 1000;
  lVar4 = 0;
  lVar5 = 0;
  if (0 < ndim) {
    lVar5 = ndim;
  }
  for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
    if (dims[lVar4] < 1) {
      pnga_error("wrong dimension specified",dims[lVar4]);
    }
  }
  IVar3 = pnga_type_f2c(type);
  if (((IVar3 < 1000) || (IVar3 = pnga_type_f2c(type), 0x4e7 < IVar3)) ||
     (IVar3 = pnga_type_f2c(type), *(int *)(BYTE_ARRAY_001d0311 + IVar3 * 0x10 + 0x5f) == 0)) {
    IVar3 = pnga_type_f2c(type);
    pnga_error("type not yet supported",IVar3);
  }
  IVar3 = pnga_type_f2c((long)(int)type);
  pgVar2 = GA;
  pgVar1 = GA + lVar6;
  GA[lVar6].type = (int)IVar3;
  pgVar2[lVar6].elemsize =
       *(int *)((long)&ga_types[0].size + ((IVar3 << 0x20) + -0x3e800000000 >> 0x1c));
  for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 1) {
    pgVar2[g_a + 1000].dims[lVar4] = dims[lVar4];
    pgVar2[g_a + 1000].chunk[lVar4] = 0;
    pgVar2[g_a + 1000].width[lVar4] = 0;
  }
  pgVar1->ndim = (short)ndim;
  return;
}

Assistant:

void pnga_set_data(Integer g_a, Integer ndim, Integer *dims, Integer type)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set data on array that has been allocated",0);
  gam_checkdim(ndim, dims);
  gam_checktype(pnga_type_f2c(type));

  GA[ga_handle].type = pnga_type_f2c((int)(type));
  GA[ga_handle].elemsize = GAsizeofM(GA[ga_handle].type);

  for (i=0; i<ndim; i++) {
    GA[ga_handle].dims[i] = (C_Integer)dims[i];
    GA[ga_handle].chunk[i] = 0;
    GA[ga_handle].width[i] = 0;
  }
  GA[ga_handle].ndim = (int)(ndim);
}